

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::IMLE(IMLE *this,int d,int D,string *filename,int pre_alloc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Param *local_38;
  
  this->d = d;
  this->D = D;
  local_38 = &this->param;
  Param::Param(local_38,d,D);
  (this->experts).
  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->experts).
  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->experts).
  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  memset(&this->zQuery,0,0x88);
  memset(&this->zeta,0,0xc0);
  memset(&this->sNearestInv,0,200);
  memset(&this->zeroZZ,0,0x90);
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)pre_alloc);
  reset(this);
  bVar1 = load(this,filename);
  if (bVar1) {
    std::operator+(&local_58,"Loaded ",filename);
    message(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"IMLE: Using default parameters.","");
    message(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
  }
  operator_delete(local_58._M_dataplus._M_p);
  return;
}

Assistant:

IMLE_base::IMLE(std::string const &filename, int pre_alloc)
#endif
{
    init( pre_alloc );
    reset();

	if( !load(filename) )
	    message(USNG_DEF_PRM);
    else
        message("Loaded " + filename);
}